

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O0

void __thiscall r_exec::_Mem::inject_async(_Mem *this,View *view)

{
  bool bVar1;
  uint uVar2;
  Code *pCVar3;
  Group *pGVar4;
  _Object *p_Var5;
  AsyncInjectionJob *this_00;
  _ReductionJob *j_00;
  EInjectionJob *this_01;
  InjectionJob *this_02;
  P<r_exec::_ReductionJob> local_38;
  P<r_exec::_ReductionJob> j;
  uint64_t ijt;
  uint64_t now;
  Group *host;
  View *view_local;
  _Mem *this_local;
  
  pCVar3 = core::P<r_code::Code>::operator->(&(view->super_View).object);
  uVar2 = (*(pCVar3->super__Object)._vptr__Object[0xe])();
  if ((uVar2 & 1) == 0) {
    pGVar4 = View::get_host(view);
    uVar2 = (*(pGVar4->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[0xe])();
    if ((uVar2 & 1) == 0) {
      p_Var5 = (_Object *)(*Now)();
      j.object = (_Object *)r_code::View::get_ijt(&view->super_View);
      if (p_Var5 < j.object) {
        pCVar3 = core::P<r_code::Code>::operator->(&(view->super_View).object);
        bVar1 = r_code::Code::is_registered(pCVar3);
        if (bVar1) {
          this_01 = (EInjectionJob *)operator_new(0x28);
          EInjectionJob::EInjectionJob(this_01,view,(uint64_t)j.object);
          pushTimeJob(this,(TimeJob *)this_01);
        }
        else {
          this_02 = (InjectionJob *)operator_new(0x28);
          InjectionJob::InjectionJob(this_02,view,(uint64_t)j.object);
          pushTimeJob(this,(TimeJob *)this_02);
        }
      }
      else {
        this_00 = (AsyncInjectionJob *)operator_new(0x20);
        AsyncInjectionJob::AsyncInjectionJob(this_00,view);
        core::P<r_exec::_ReductionJob>::P(&local_38,(_ReductionJob *)this_00);
        j_00 = core::P::operator_cast_to__ReductionJob_((P *)&local_38);
        pushReductionJob(this,j_00);
        core::P<r_exec::_ReductionJob>::~P(&local_38);
      }
    }
  }
  return;
}

Assistant:

void _Mem::inject_async(View *view)
{
    if (view->object->is_invalidated()) {
        return;
    }

    Group *host = view->get_host();

    if (host->is_invalidated()) {
        return;
    }

    uint64_t now = Now();
    uint64_t ijt = view->get_ijt();

    if (ijt <= now) {
        P<_ReductionJob> j = new AsyncInjectionJob(view);
        pushReductionJob(j);
    } else {
        if (view->object->is_registered()) { // existing object.
            pushTimeJob(new EInjectionJob(view, ijt));
        } else {
            pushTimeJob(new InjectionJob(view, ijt));
        }
    }
}